

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.h
# Opt level: O0

int __thiscall soplex::NameSet::number(NameSet *this,char *str)

{
  bool bVar1;
  Name *in_RSI;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *in_RDI;
  Name nam;
  Name in_stack_ffffffffffffffe0;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this_00;
  int local_4;
  
  this_00 = in_RDI;
  Name::Name((Name *)&stack0xffffffffffffffe0,(char *)in_RSI);
  bVar1 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::has
                    ((DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *)
                     in_stack_ffffffffffffffe0.name,(Name *)in_RDI);
  if (bVar1) {
    DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::get(this_00,in_RSI);
    local_4 = number((NameSet *)in_stack_ffffffffffffffe0.name,(DataKey *)in_RDI);
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int number(const char* str) const
   {
      const Name nam(str);

      if(hashtab.has(nam))
      {
         assert(hashtab.get(nam) != nullptr);
         return number(*hashtab.get(nam));
      }
      else
         return -1;
   }